

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__0,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_4c1942eb comp,int bad_allowed,bool leftmost)

{
  uint *puVar1;
  uint *puVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  pointer pdVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  uint *puVar11;
  _DistanceType __len;
  ulong uVar12;
  int *piVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  int iVar15;
  int iVar16;
  long lVar17;
  uint *puVar18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var19;
  ulong uVar20;
  uint *puVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int *piVar25;
  ulong uVar26;
  bool bVar27;
  double dVar28;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:5515:47)>
  __cmp;
  int local_4c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  
  uVar12 = (long)end._M_current - (long)begin._M_current >> 2;
  if ((long)uVar12 < 0x18) {
    if (!leftmost) {
LAB_0031f40c:
      if (begin._M_current == end._M_current) {
        return;
      }
      if (begin._M_current + 1 == end._M_current) {
        return;
      }
      pdVar6 = ((comp.reducedcost)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = begin._M_current + 1;
      do {
        piVar13 = piVar10;
        iVar16 = begin._M_current[1];
        lVar9 = (long)*begin._M_current;
        dVar28 = pdVar6[iVar16];
        piVar10 = piVar13;
        if ((pdVar6[lVar9] < dVar28) || ((*begin._M_current < iVar16 && (pdVar6[lVar9] <= dVar28))))
        {
          while( true ) {
            *piVar10 = (int)lVar9;
            lVar9 = (long)piVar10[-2];
            if ((dVar28 <= pdVar6[lVar9]) && ((iVar16 <= piVar10[-2] || (dVar28 < pdVar6[lVar9]))))
            break;
            piVar10 = piVar10 + -1;
          }
          piVar10[-1] = iVar16;
        }
        piVar10 = piVar13 + 1;
        begin._M_current = piVar13;
      } while (piVar13 + 1 != end._M_current);
      return;
    }
  }
  else {
    puVar1 = (uint *)(end._M_current + -1);
    lVar9 = (long)end._M_current - (long)begin._M_current;
    local_4c = bad_allowed;
    local_48._M_current = begin._M_current;
    do {
      uVar20 = uVar12 >> 1;
      pdVar6 = ((comp.reducedcost)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar12 < 0x81) {
        uVar7 = *local_48._M_current;
        uVar4 = local_48._M_current[uVar20];
        dVar28 = pdVar6[(int)uVar7];
        dVar3 = pdVar6[(int)uVar4];
        if ((dVar3 < dVar28) || (((int)uVar4 < (int)uVar7 && (dVar3 <= dVar28)))) {
          local_48._M_current[uVar20] = uVar7;
          *local_48._M_current = uVar4;
          dVar28 = dVar3;
          uVar7 = uVar4;
        }
        uVar4 = *puVar1;
        if ((dVar28 < pdVar6[(int)uVar4]) ||
           (((int)uVar7 < (int)uVar4 && (dVar28 <= pdVar6[(int)uVar4])))) {
          *local_48._M_current = uVar4;
          *puVar1 = uVar7;
          uVar7 = *local_48._M_current;
        }
        iVar16 = local_48._M_current[uVar20];
        uVar22 = (ulong)iVar16;
        if ((pdVar6[uVar22] < pdVar6[(int)uVar7]) ||
           ((iVar16 < (int)uVar7 && (pdVar6[uVar22] <= pdVar6[(int)uVar7])))) {
          local_48._M_current[uVar20] = uVar7;
          *local_48._M_current = iVar16;
        }
        else {
          uVar22 = (ulong)uVar7;
        }
      }
      else {
        uVar7 = local_48._M_current[uVar20];
        uVar4 = *local_48._M_current;
        dVar28 = pdVar6[(int)uVar7];
        dVar3 = pdVar6[(int)uVar4];
        if ((dVar3 < dVar28) || (((int)uVar4 < (int)uVar7 && (dVar3 <= dVar28)))) {
          *local_48._M_current = uVar7;
          local_48._M_current[uVar20] = uVar4;
          dVar28 = dVar3;
          uVar7 = uVar4;
        }
        uVar4 = *puVar1;
        if ((dVar28 < pdVar6[(int)uVar4]) ||
           (((int)uVar7 < (int)uVar4 && (dVar28 <= pdVar6[(int)uVar4])))) {
          local_48._M_current[uVar20] = uVar4;
          *puVar1 = uVar7;
          uVar7 = local_48._M_current[uVar20];
        }
        iVar16 = *local_48._M_current;
        if ((pdVar6[iVar16] < pdVar6[(int)uVar7]) ||
           ((iVar16 < (int)uVar7 && (pdVar6[iVar16] <= pdVar6[(int)uVar7])))) {
          *local_48._M_current = uVar7;
          local_48._M_current[uVar20] = iVar16;
        }
        iVar8 = local_48._M_current[uVar20 - 1];
        iVar16 = local_48._M_current[1];
        dVar28 = pdVar6[iVar8];
        dVar3 = pdVar6[iVar16];
        if ((dVar3 < dVar28) || ((iVar16 < iVar8 && (dVar3 <= dVar28)))) {
          local_48._M_current[1] = iVar8;
          local_48._M_current[uVar20 - 1] = iVar16;
          dVar28 = dVar3;
          iVar8 = iVar16;
        }
        iVar16 = end._M_current[-2];
        if ((dVar28 < pdVar6[iVar16]) || ((iVar8 < iVar16 && (dVar28 <= pdVar6[iVar16])))) {
          local_48._M_current[uVar20 - 1] = iVar16;
          end._M_current[-2] = iVar8;
          iVar8 = local_48._M_current[uVar20 - 1];
        }
        iVar16 = local_48._M_current[1];
        if ((pdVar6[iVar16] < pdVar6[iVar8]) ||
           ((iVar16 < iVar8 && (pdVar6[iVar16] <= pdVar6[iVar8])))) {
          local_48._M_current[1] = iVar8;
          local_48._M_current[uVar20 - 1] = iVar16;
        }
        iVar8 = local_48._M_current[uVar20 + 1];
        iVar16 = local_48._M_current[2];
        dVar28 = pdVar6[iVar8];
        dVar3 = pdVar6[iVar16];
        if ((dVar3 < dVar28) || ((iVar16 < iVar8 && (dVar3 <= dVar28)))) {
          local_48._M_current[2] = iVar8;
          local_48._M_current[uVar20 + 1] = iVar16;
          dVar28 = dVar3;
          iVar8 = iVar16;
        }
        iVar16 = end._M_current[-3];
        if ((dVar28 < pdVar6[iVar16]) || ((iVar8 < iVar16 && (dVar28 <= pdVar6[iVar16])))) {
          local_48._M_current[uVar20 + 1] = iVar16;
          end._M_current[-3] = iVar8;
          iVar8 = local_48._M_current[uVar20 + 1];
        }
        iVar16 = local_48._M_current[2];
        if ((pdVar6[iVar16] < pdVar6[iVar8]) ||
           ((iVar16 < iVar8 && (pdVar6[iVar16] <= pdVar6[iVar8])))) {
          local_48._M_current[2] = iVar8;
          local_48._M_current[uVar20 + 1] = iVar16;
          iVar8 = iVar16;
        }
        iVar16 = local_48._M_current[uVar20];
        iVar5 = local_48._M_current[uVar20 - 1];
        dVar28 = pdVar6[iVar16];
        dVar3 = pdVar6[iVar5];
        if ((dVar3 < dVar28) || ((iVar15 = iVar5, iVar5 < iVar16 && (dVar3 <= dVar28)))) {
          local_48._M_current[uVar20 - 1] = iVar16;
          local_48._M_current[uVar20] = iVar5;
          dVar28 = dVar3;
          iVar15 = iVar16;
          iVar16 = iVar5;
        }
        lVar17 = (long)iVar8;
        if ((dVar28 < pdVar6[lVar17]) || ((iVar16 < iVar8 && (dVar28 <= pdVar6[lVar17])))) {
          local_48._M_current[uVar20] = iVar8;
          local_48._M_current[uVar20 + 1] = iVar16;
          iVar16 = iVar8;
        }
        else {
          lVar17 = (long)iVar16;
        }
        if ((pdVar6[iVar15] < pdVar6[lVar17]) ||
           ((iVar15 < iVar16 && (pdVar6[iVar15] <= pdVar6[lVar17])))) {
          local_48._M_current[uVar20 - 1] = iVar16;
          local_48._M_current[uVar20] = iVar15;
          iVar16 = iVar15;
        }
        iVar8 = *local_48._M_current;
        *local_48._M_current = iVar16;
        local_48._M_current[uVar20] = iVar8;
        uVar22 = (ulong)(uint)*local_48._M_current;
      }
      iVar16 = (int)uVar22;
      if ((leftmost & 1U) == 0) {
        dVar28 = pdVar6[iVar16];
        if ((dVar28 < pdVar6[local_48._M_current[-1]]) ||
           ((iVar16 < local_48._M_current[-1] && (dVar28 <= pdVar6[local_48._M_current[-1]]))))
        goto LAB_0031eee2;
        lVar9 = 0;
        while( true ) {
          lVar17 = (long)*(int *)((long)puVar1 + lVar9);
          if ((dVar28 <= pdVar6[lVar17]) &&
             ((iVar16 <= *(int *)((long)puVar1 + lVar9) || (dVar28 < pdVar6[lVar17])))) break;
          lVar9 = lVar9 + -4;
        }
        piVar10 = (int *)((long)puVar1 + lVar9);
        if (lVar9 == 0) {
          uVar22 = uVar22 & 0xffffffff;
          _Var14._M_current = local_48._M_current;
          while (_Var14._M_current < piVar10) {
            _Var14._M_current = _Var14._M_current + 1;
            uVar22 = (ulong)*_Var14._M_current;
            if ((pdVar6[uVar22] < dVar28) ||
               (*_Var14._M_current < iVar16 && pdVar6[uVar22] <= dVar28)) break;
          }
        }
        else {
          piVar13 = local_48._M_current + 1;
          do {
            _Var14._M_current = piVar13;
            uVar22 = (ulong)*_Var14._M_current;
            if (pdVar6[uVar22] < dVar28) break;
            piVar13 = _Var14._M_current + 1;
          } while ((iVar16 <= *_Var14._M_current) || (dVar28 < pdVar6[uVar22]));
        }
LAB_0031f3e0:
        if (_Var14._M_current < piVar10) {
          *_Var14._M_current = (int)lVar17;
          *piVar10 = (int)uVar22;
          do {
            do {
              piVar10 = piVar10 + -1;
              lVar17 = (long)*piVar10;
            } while (pdVar6[lVar17] < dVar28);
          } while ((*piVar10 < iVar16) && (pdVar6[lVar17] <= dVar28));
          piVar13 = _Var14._M_current + 1;
          do {
            _Var14._M_current = piVar13;
            uVar22 = (ulong)*_Var14._M_current;
            if (pdVar6[uVar22] < dVar28) break;
            piVar13 = _Var14._M_current + 1;
          } while ((iVar16 <= *_Var14._M_current) || (dVar28 < pdVar6[uVar22]));
          goto LAB_0031f3e0;
        }
        *local_48._M_current = (int)lVar17;
        *piVar10 = iVar16;
        begin._M_current = piVar10 + 1;
        lVar17 = (long)end._M_current - (long)begin._M_current;
        uVar12 = lVar17 >> 2;
      }
      else {
        dVar28 = pdVar6[iVar16];
LAB_0031eee2:
        uVar20 = 4;
        while( true ) {
          lVar17 = (long)*(local_48._M_current + uVar20);
          if ((pdVar6[lVar17] <= dVar28) &&
             ((*(local_48._M_current + uVar20) <= iVar16 || (pdVar6[lVar17] < dVar28)))) break;
          uVar20 = uVar20 + 4;
        }
        puVar2 = (uint *)((long)local_48._M_current + uVar20);
        puVar11 = puVar1;
        if (uVar20 == 4) {
          while (puVar21 = puVar11, puVar18 = puVar21 + 1, puVar2 < puVar21 + 1) {
            puVar18 = puVar21;
            if ((dVar28 < pdVar6[(int)*puVar21]) ||
               ((puVar11 = puVar21 + -1, iVar16 < (int)*puVar21 && (dVar28 <= pdVar6[(int)*puVar21])
                ))) break;
          }
        }
        else {
          do {
            puVar18 = puVar11;
            if (dVar28 < pdVar6[(int)*puVar18]) break;
            puVar11 = puVar18 + -1;
          } while (((int)*puVar18 <= iVar16) || (pdVar6[(int)*puVar18] < dVar28));
        }
        if (puVar2 < puVar18) {
          uVar26 = (ulong)*puVar18;
          puVar11 = puVar18;
          do {
            *(int *)((long)local_48._M_current + uVar20) = (int)uVar26;
            *puVar11 = (uint)lVar17;
            uVar22 = uVar20;
            while( true ) {
              iVar8 = *(local_48._M_current + uVar22 + 4);
              lVar17 = (long)iVar8;
              if ((pdVar6[lVar17] <= dVar28) && ((iVar8 <= iVar16 || (pdVar6[lVar17] < dVar28))))
              break;
              uVar22 = uVar22 + 4;
            }
            uVar20 = uVar22 + 4;
            puVar21 = puVar11 + -1;
            do {
              puVar11 = puVar21;
              uVar26 = (ulong)(int)*puVar11;
              if (dVar28 < pdVar6[uVar26]) break;
              puVar21 = puVar11 + -1;
            } while (((int)*puVar11 <= iVar16) || (pdVar6[uVar26] < dVar28));
          } while ((uint *)((long)local_48._M_current + uVar22 + 4) < puVar11);
        }
        else {
          uVar22 = uVar20 - 4;
        }
        _Var14._M_current = local_48._M_current + uVar22;
        piVar10 = local_48._M_current + uVar22;
        begin._M_current = piVar10 + 1;
        *local_48._M_current = *piVar10;
        *piVar10 = iVar16;
        uVar20 = (long)_Var14._M_current - (long)local_48._M_current >> 2;
        lVar17 = (long)end._M_current - (long)begin._M_current;
        uVar26 = lVar17 >> 2;
        if (((long)uVar20 < (long)(uVar12 >> 3)) || ((long)uVar26 < (long)(uVar12 >> 3))) {
          local_4c = local_4c + -1;
          if (local_4c == 0) {
            uVar20 = uVar12 - 2 >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__0>>
                        (local_48,uVar20,uVar12,local_48._M_current[uVar20],
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:5515:47)>
                          )comp.reducedcost);
              bVar27 = uVar20 != 0;
              uVar20 = uVar20 - 1;
            } while (bVar27);
            if (lVar9 < 5) {
              return;
            }
            lVar9 = (long)end._M_current - (long)local_48._M_current;
            do {
              end._M_current = end._M_current + -1;
              iVar16 = *end._M_current;
              *end._M_current = *local_48._M_current;
              lVar9 = lVar9 + -4;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__0>>
                        (local_48,0,lVar9 >> 2,iVar16,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:5515:47)>
                          )comp.reducedcost);
            } while (4 < lVar9);
            return;
          }
          if (0x17 < (long)uVar20) {
            uVar12 = uVar20 & 0xfffffffffffffffc;
            iVar16 = *local_48._M_current;
            *local_48._M_current = *(local_48._M_current + uVar12);
            *(local_48._M_current + uVar12) = iVar16;
            iVar16 = _Var14._M_current[-1];
            _Var14._M_current[-1] = *(_Var14._M_current - uVar12);
            *(_Var14._M_current - uVar12) = iVar16;
            if (0x80 < uVar20) {
              uVar20 = uVar20 >> 2;
              iVar16 = local_48._M_current[1];
              local_48._M_current[1] = local_48._M_current[uVar20 + 1];
              local_48._M_current[uVar20 + 1] = iVar16;
              iVar16 = local_48._M_current[2];
              local_48._M_current[2] = local_48._M_current[uVar20 + 2];
              local_48._M_current[uVar20 + 2] = iVar16;
              iVar16 = _Var14._M_current[-2];
              _Var14._M_current[-2] = _Var14._M_current[~uVar20];
              _Var14._M_current[~uVar20] = iVar16;
              iVar16 = _Var14._M_current[-3];
              _Var14._M_current[-3] = _Var14._M_current[-2 - uVar20];
              _Var14._M_current[-2 - uVar20] = iVar16;
            }
          }
          if (0x17 < (long)uVar26) {
            uVar12 = uVar26 & 0xfffffffffffffffc;
            iVar16 = _Var14._M_current[1];
            _Var14._M_current[1] = *(_Var14._M_current + uVar12 + 4);
            *(_Var14._M_current + uVar12 + 4) = iVar16;
            iVar16 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar12);
            *(end._M_current - uVar12) = iVar16;
            if (0x80 < uVar26) {
              uVar12 = uVar26 >> 2;
              iVar16 = _Var14._M_current[2];
              _Var14._M_current[2] = _Var14._M_current[uVar12 + 2];
              _Var14._M_current[uVar12 + 2] = iVar16;
              iVar16 = _Var14._M_current[3];
              _Var14._M_current[3] = _Var14._M_current[uVar12 + 3];
              _Var14._M_current[uVar12 + 3] = iVar16;
              iVar16 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar12];
              end._M_current[~uVar12] = iVar16;
              iVar16 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar12];
              end._M_current[-2 - uVar12] = iVar16;
            }
          }
        }
        else if (puVar18 <= puVar2) {
          if ((uVar22 & 0xfffffffffffffffb) != 0) {
            lVar9 = 0;
            uVar12 = 0;
            _Var19._M_current = local_48._M_current;
            piVar13 = local_48._M_current + 1;
            do {
              iVar16 = _Var19._M_current[1];
              iVar8 = *_Var19._M_current;
              dVar28 = pdVar6[iVar16];
              if ((pdVar6[iVar8] < dVar28) || ((iVar8 < iVar16 && (pdVar6[iVar8] <= dVar28)))) {
                _Var19._M_current[1] = iVar8;
                _Var19._M_current = local_48._M_current;
                lVar23 = lVar9;
                if (piVar13 + -1 != local_48._M_current) {
                  do {
                    iVar8 = *(local_48._M_current + lVar23 + -4);
                    if ((dVar28 <= pdVar6[iVar8]) && ((iVar16 <= iVar8 || (dVar28 < pdVar6[iVar8])))
                       ) {
                      _Var19._M_current = lVar23 + local_48._M_current;
                      break;
                    }
                    *(local_48._M_current + lVar23) = iVar8;
                    lVar23 = lVar23 + -4;
                  } while (lVar23 != 0);
                }
                *_Var19._M_current = iVar16;
                uVar12 = uVar12 + ((long)piVar13 - (long)_Var19._M_current >> 2);
                if (8 < uVar12) goto LAB_0031f2bc;
              }
              piVar25 = piVar13 + 1;
              lVar9 = lVar9 + 4;
              _Var19._M_current = piVar13;
              piVar13 = piVar25;
            } while (piVar25 != _Var14._M_current);
          }
          if (begin._M_current == end._M_current) {
            return;
          }
          if (_Var14._M_current + 2 == end._M_current) {
            return;
          }
          lVar9 = 8;
          lVar23 = 0;
          uVar12 = 0;
          piVar13 = begin._M_current;
          do {
            iVar16 = *piVar13;
            piVar13 = _Var14._M_current + lVar9;
            iVar8 = *(_Var14._M_current + lVar9);
            dVar28 = pdVar6[iVar8];
            if ((pdVar6[iVar16] < dVar28) || ((iVar16 < iVar8 && (pdVar6[iVar16] <= dVar28)))) {
              *piVar13 = iVar16;
              piVar25 = begin._M_current;
              lVar24 = lVar23;
              if (lVar9 != 8) {
                do {
                  iVar16 = *(int *)((long)piVar10 + lVar24);
                  if ((dVar28 <= pdVar6[iVar16]) && ((iVar8 <= iVar16 || (dVar28 < pdVar6[iVar16])))
                     ) {
                    piVar25 = lVar24 + begin._M_current;
                    break;
                  }
                  *(begin._M_current + lVar24) = iVar16;
                  lVar24 = lVar24 + -4;
                } while (lVar24 != 0);
              }
              *piVar25 = iVar8;
              uVar12 = uVar12 + ((long)piVar13 - (long)piVar25 >> 2);
              if (8 < uVar12) break;
            }
            lVar24 = lVar9 + 4;
            lVar9 = lVar9 + 4;
            lVar23 = lVar23 + 4;
            if (_Var14._M_current + lVar24 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_0031f2bc:
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__0,false>
                  (local_48,_Var14,comp,local_4c,(bool)(leftmost & 1));
        leftmost = false;
        uVar12 = uVar26;
      }
      lVar9 = lVar17;
      local_48._M_current = begin._M_current;
    } while (0x17 < (long)uVar12);
    if ((leftmost & 1U) == 0) goto LAB_0031f40c;
  }
  if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
    pdVar6 = ((comp.reducedcost)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    piVar10 = begin._M_current;
    piVar13 = begin._M_current + 1;
    do {
      iVar16 = piVar10[1];
      iVar8 = *piVar10;
      dVar28 = pdVar6[iVar16];
      if ((pdVar6[iVar8] < dVar28) || ((iVar8 < iVar16 && (pdVar6[iVar8] <= dVar28)))) {
        piVar10[1] = iVar8;
        piVar10 = begin._M_current;
        lVar17 = lVar9;
        if (piVar13 + -1 != begin._M_current) {
          do {
            iVar8 = *(begin._M_current + lVar17 + -4);
            if ((dVar28 <= pdVar6[iVar8]) && ((iVar16 <= iVar8 || (dVar28 < pdVar6[iVar8])))) {
              piVar10 = lVar17 + begin._M_current;
              break;
            }
            *(begin._M_current + lVar17) = iVar8;
            lVar17 = lVar17 + -4;
          } while (lVar17 != 0);
        }
        *piVar10 = iVar16;
      }
      piVar25 = piVar13 + 1;
      lVar9 = lVar9 + 4;
      piVar10 = piVar13;
      piVar13 = piVar25;
    } while (piVar25 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }